

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void * NULLC::GetBasePointer(void *ptr)

{
  uint *puVar1;
  iterator pnVar2;
  void *block;
  BigBlockIterator it;
  void *base_6;
  void *base_5;
  void *base_4;
  void *base_3;
  void *base_2;
  void *base_1;
  void *base;
  void *ptr_local;
  
  base = ptr;
  base_1 = ObjectBlockPool<8,_8192>::GetBasePointer((ObjectBlockPool<8,_8192> *)pool8,ptr);
  ptr_local = base_1;
  if (((((base_1 == (void *)0x0) &&
        (base_2 = ObjectBlockPool<16,_4096>::GetBasePointer
                            ((ObjectBlockPool<16,_4096> *)pool16,base), ptr_local = base_2,
        base_2 == (void *)0x0)) &&
       (base_3 = ObjectBlockPool<32,_2048>::GetBasePointer((ObjectBlockPool<32,_2048> *)pool32,base)
       , ptr_local = base_3, base_3 == (void *)0x0)) &&
      ((base_4 = ObjectBlockPool<64,_1024>::GetBasePointer((ObjectBlockPool<64,_1024> *)pool64,base)
       , ptr_local = base_4, base_4 == (void *)0x0 &&
       (base_5 = ObjectBlockPool<128,_512>::GetBasePointer
                           ((ObjectBlockPool<128,_512> *)pool128,base), ptr_local = base_5,
       base_5 == (void *)0x0)))) &&
     ((base_6 = ObjectBlockPool<256,_256>::GetBasePointer((ObjectBlockPool<256,_256> *)pool256,base)
      , ptr_local = base_6, base_6 == (void *)0x0 &&
      (it = (BigBlockIterator)
            ObjectBlockPool<512,_128>::GetBasePointer((ObjectBlockPool<512,_128> *)pool512,base),
      ptr_local = it, it == (BigBlockIterator)0x0)))) {
    Range::Range((Range *)&block,base,base);
    pnVar2 = Tree<NULLC::Range>::find((Tree<NULLC::Range> *)bigBlocks,(Range *)&block);
    if (((pnVar2 == (iterator)0x0) || (puVar1 = (uint *)(pnVar2->key).start, base < puVar1)) ||
       ((void *)((long)puVar1 + (ulong)*puVar1) < base)) {
      ptr_local = (void *)0x0;
    }
    else {
      ptr_local = puVar1 + 3;
    }
  }
  return ptr_local;
}

Assistant:

void* NULLC::GetBasePointer(void* ptr)
{
	// Search in range of every pool
	if(void *base = pool8.GetBasePointer(ptr))
		return base;
	if(void *base = pool16.GetBasePointer(ptr))
		return base;
	if(void *base = pool32.GetBasePointer(ptr))
		return base;
	if(void *base = pool64.GetBasePointer(ptr))
		return base;
	if(void *base = pool128.GetBasePointer(ptr))
		return base;
	if(void *base = pool256.GetBasePointer(ptr))
		return base;
	if(void *base = pool512.GetBasePointer(ptr))
		return base;

	// Search in global pool
	if(BigBlockIterator it = bigBlocks.find(Range(ptr, ptr)))
	{
		void *block = it->key.start;

		if(ptr >= block && ptr <= (char*)block + *(unsigned int*)block)
			return (char*)block + 4 + sizeof(markerType);
	}

	return NULL;
}